

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

bool __thiscall
r_exec::CTPX::build_mdl
          (CTPX *this,_Fact *f_icst,_Fact *cause_pattern,_Fact *consequent,
          GuardBuilder *guard_builder,uint64_t period)

{
  bool bVar1;
  int iVar2;
  BindingMap *pBVar3;
  _Fact *p_Var4;
  undefined4 extraout_var;
  Code *pCVar5;
  HLPBindingMap *pHVar6;
  Code *m0;
  uint16_t write_index;
  P<r_exec::BindingMap> local_40;
  P<r_exec::BindingMap> bm;
  uint64_t period_local;
  GuardBuilder *guard_builder_local;
  _Fact *consequent_local;
  _Fact *cause_pattern_local;
  _Fact *f_icst_local;
  CTPX *this_local;
  
  bm.object = (_Object *)period;
  pBVar3 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(pBVar3);
  core::P<r_exec::BindingMap>::P(&local_40,pBVar3);
  pBVar3 = core::P<r_exec::BindingMap>::operator->(&local_40);
  p_Var4 = core::P<r_exec::_Fact>::operator->(&(this->super__TPX).super_TPX.target);
  iVar2 = (*(p_Var4->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(p_Var4,0);
  BindingMap::init(pBVar3,(EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar2));
  pBVar3 = core::P<r_exec::BindingMap>::operator->(&local_40);
  pCVar5 = core::P::operator_cast_to_Code_((P *)&(this->super__TPX).super_TPX.target);
  BindingMap::init(pBVar3,(EVP_PKEY_CTX *)pCVar5);
  pBVar3 = core::P<r_exec::BindingMap>::operator->(&local_40);
  pCVar5 = core::P::operator_cast_to_Code_((P *)&(this->super__TPX).super_TPX.target);
  BindingMap::init(pBVar3,(EVP_PKEY_CTX *)pCVar5);
  pHVar6 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_40);
  pCVar5 = _TPX::build_mdl_head
                     (&this->super__TPX,pHVar6,3,f_icst,consequent,(uint16_t *)((long)&m0 + 2));
  (*(guard_builder->super__Object)._vptr__Object[2])
            (guard_builder,pCVar5,0,cause_pattern,(long)&m0 + 2);
  _TPX::build_mdl_tail(&this->super__TPX,pCVar5,m0._2_2_);
  pHVar6 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_40);
  bVar1 = build_requirement(this,pHVar6,pCVar5,(uint64_t)bm.object);
  core::P<r_exec::BindingMap>::~P(&local_40);
  return bVar1;
}

Assistant:

bool CTPX::build_mdl(_Fact *f_icst, _Fact *cause_pattern, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period)
{
    P<BindingMap> bm = new BindingMap();
    bm->init(target->get_reference(0), MK_VAL_VALUE);
    bm->init(target, FACT_AFTER);
    bm->init(target, FACT_BEFORE);
    uint16_t write_index;
    Code *m0 = build_mdl_head(bm, 3, f_icst, consequent, write_index);
    guard_builder->build(m0, nullptr, cause_pattern, write_index);
    build_mdl_tail(m0, write_index);
    return build_requirement(bm, m0, period); // existence checks performed there.
}